

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rand.cpp
# Opt level: O1

ON__UINT32 on_random_number(ON_RANDOM_NUMBER_CONTEXT *randcontext)

{
  long lVar1;
  uint uVar2;
  
  if (0x26f < randcontext->mti) {
    if (randcontext->mti != 0x270) {
      randcontext->mt[0] = 0x1571;
      uVar2 = 0x1571;
      lVar1 = 2;
      do {
        uVar2 = ((uVar2 >> 0x1e ^ uVar2) * 0x6c078965 + (int)lVar1) - 1;
        randcontext->mt[lVar1 + -1] = uVar2;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x271);
      randcontext->mti = 0x270;
    }
    lVar1 = 0;
    do {
      randcontext->mt[lVar1] =
           on_random_number::mag01[randcontext->mt[lVar1 + 1] & 1] ^ randcontext->mt[lVar1 + 0x18d]
           ^ (randcontext->mt[lVar1 + 1] & 0x7ffffffe | randcontext->mt[lVar1] & 0x80000000) >> 1;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0xe3);
    lVar1 = 0xe5;
    do {
      randcontext->mt[lVar1 + -2] =
           on_random_number::mag01[randcontext->mt[lVar1 + -1] & 1] ^
           *(uint *)((long)randcontext + lVar1 * 4 + -0x390) ^
           (randcontext->mt[lVar1 + -1] & 0x7ffffffe | randcontext->mt[lVar1 + -2] & 0x80000000) >>
           1;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x271);
    randcontext->mt[0x26f] =
         on_random_number::mag01[randcontext->mt[0] & 1] ^ randcontext->mt[0x18c] ^
         (randcontext->mt[0] & 0x7ffffffe | randcontext->mt[0x26f] & 0x80000000) >> 1;
    randcontext->mti = 0;
  }
  uVar2 = randcontext->mti;
  randcontext->mti = uVar2 + 1;
  uVar2 = randcontext->mt[uVar2] >> 0xb ^ randcontext->mt[uVar2];
  uVar2 = (uVar2 & 0x13a58ad) << 7 ^ uVar2;
  uVar2 = (uVar2 & 0x1df8c) << 0xf ^ uVar2;
  return uVar2 >> 0x12 ^ uVar2;
}

Assistant:

ON__UINT32 on_random_number(struct ON_RANDOM_NUMBER_CONTEXT* randcontext)
{
  static const ON__UINT32 mag01[2]={0x0UL, MATRIX_A};
  ON__UINT32 kk, y;
  /* mag01[x] = x * MATRIX_A  for x=0,1 */

  if (randcontext->mti >= N) 
  {
    /* generate N words at one time */
    if (randcontext->mti >= N+1)
    {
      /* if randcontext has never been initialized */
      on_random_number_seed(5489UL,randcontext); /* a default initial seed is used */
    }

    for (kk=0;kk<N-M;kk++)
    {
      y = (randcontext->mt[kk]&UPPER_MASK)|(randcontext->mt[kk+1]&LOWER_MASK);
      randcontext->mt[kk] = randcontext->mt[kk+M] ^ (y >> 1) ^ mag01[y & 0x1UL];
    }
    for (;kk<N-1;kk++) 
    {
      y = (randcontext->mt[kk]&UPPER_MASK)|(randcontext->mt[kk+1]&LOWER_MASK);
      randcontext->mt[kk] = randcontext->mt[kk+(M-N)] ^ (y >> 1) ^ mag01[y & 0x1UL];
    }
    y = (randcontext->mt[N-1]&UPPER_MASK)|(randcontext->mt[0]&LOWER_MASK);
    randcontext->mt[N-1] = randcontext->mt[M-1] ^ (y >> 1) ^ mag01[y & 0x1UL];

    randcontext->mti = 0;
  }

  y = randcontext->mt[randcontext->mti++];

  /* Tempering */
  y ^= (y >> 11);
  y ^= (y << 7) & 0x9d2c5680UL;
  y ^= (y << 15) & 0xefc60000UL;
  y ^= (y >> 18);

  return y;
}